

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall cg_other::set(cg_other *this,point p,int ch)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator __position;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  cgo_char local_10;
  
  pcVar2 = (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if ((long)__position._M_current - (long)pcVar2 != 0) {
    uVar3 = ((long)__position._M_current - (long)pcVar2 >> 2) * -0x5555555555555555;
    uVar4 = 1;
    uVar5 = 0;
    do {
      if (pcVar2[uVar5].p == p) {
        pcVar2[uVar5].ch = ch;
        return;
      }
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  if (__position._M_current ==
      (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.p = p;
    local_10.ch = ch;
    std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
    _M_realloc_insert<cg_other::cgo_char>(&this->data,__position,&local_10);
  }
  else {
    (__position._M_current)->ch = ch;
    (__position._M_current)->p = p;
    ppcVar1 = &(this->data).
               super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

void cg_other::set(point p, int ch) { //TODO
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) {
            data[i].ch = ch;
            return;
        }
    }
    data.push_back({ p, ch });
}